

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_len(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  long lVar1;
  ValueDict local_c0;
  Value local_a8;
  Value local_98;
  undefined1 local_88 [8];
  String str;
  Value local_70;
  undefined1 local_60 [8];
  ValueList list;
  String local_40;
  ValueType local_30;
  Value val;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  val.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"self");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  if (local_30 == List) {
    Value::GetList((Value *)local_60);
    lVar1 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)local_60);
    Value::Value(&local_70,(double)lVar1);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_70,true);
    Value::~Value(&local_70);
    str._12_4_ = 1;
    List<MiniScript::Value>::~List((List<MiniScript::Value> *)local_60);
  }
  else if (local_30 == String) {
    Value::GetString((Value *)local_88);
    lVar1 = String::Length((String *)local_88);
    Value::Value(&local_98,(double)lVar1);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_98,true);
    Value::~Value(&local_98);
    str._12_4_ = 1;
    String::~String((String *)local_88);
  }
  else if (local_30 == Map) {
    Value::GetDict(&local_c0,(Value *)&stack0xffffffffffffffd0);
    lVar1 = Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Count
                      (&local_c0);
    Value::Value(&local_a8,(double)lVar1);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_a8,true);
    Value::~Value(&local_a8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary(&local_c0)
    ;
    str._12_4_ = 1;
  }
  else {
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
    str._12_4_ = 1;
  }
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_len(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			return IntrinsicResult(list.Count());
		} else if (val.type == ValueType::String) {
			String str = val.GetString();
			return IntrinsicResult(str.Length());
		} else if (val.type == ValueType::Map) {
			return IntrinsicResult(val.GetDict().Count());
		}
		return IntrinsicResult::Null;
	}